

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void hgdb::json::SymbolTable::walk_up<false>
               (ScopeBase *scope,function<bool_(hgdb::json::ScopeBase_*)> *terminate)

{
  ScopeBase *scope_00;
  bool bVar1;
  ScopeBase *__args;
  bool res;
  ScopeBase *s;
  uint64_t i;
  ScopeBase *parent;
  function<bool_(hgdb::json::ScopeBase_*)> *terminate_local;
  ScopeBase *scope_local;
  
  scope_00 = scope->parent;
  if (scope_00 != (ScopeBase *)0x0) {
    for (s = (ScopeBase *)scope->index_; s != (ScopeBase *)0x0;
        s = (ScopeBase *)((long)&s[-1].index_ + 7)) {
      __args = ScopeBase::operator[](scope_00,(uint64_t)((long)&s[-1].index_ + 7));
      bVar1 = std::function<bool_(hgdb::json::ScopeBase_*)>::operator()(terminate,__args);
      if (bVar1) {
        return;
      }
    }
    walk_up<false>(scope_00,terminate);
  }
  return;
}

Assistant:

static void walk_up(ScopeBase *scope, const std::function<bool(ScopeBase *)> &terminate) {
        auto *parent = scope->parent;
        if (!parent) return;
        if constexpr (include_current) {
            // NOLINTNEXTLINE
            for (auto child = scope->rbegin(); child != scope->rend(); child++) {
                auto res = terminate(child->get());
                if (res) return;
            }
        }

        for (auto i = scope->index_; i > 0; i--) {
            auto &s = parent->operator[](i - 1);
            auto res = terminate(&s);
            if (res) return;
        }
        walk_up<false>(parent, terminate);
    }